

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_complete(char *zSql)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int local_24;
  int nId;
  int c;
  u8 token;
  u8 state;
  char *zSql_local;
  
  nId._3_1_ = 0;
  _c = (byte *)zSql;
  do {
    if (*_c == 0) {
      return (uint)(nId._3_1_ == 1);
    }
    switch(*_c) {
    case 9:
    case 10:
    case 0xc:
    case 0xd:
    case 0x20:
      nId._2_1_ = 1;
      break;
    default:
      if ((""[*_c] & 0x46) == 0) {
        nId._2_1_ = 2;
      }
      else {
        local_24 = 1;
        while ((""[_c[local_24]] & 0x46) != 0) {
          local_24 = local_24 + 1;
        }
        bVar1 = *_c;
        if (bVar1 == 0x43) {
LAB_001c44ae:
          if ((local_24 == 6) && (iVar2 = sqlite3_strnicmp((char *)_c,"create",6), iVar2 == 0)) {
            nId._2_1_ = 4;
          }
          else {
            nId._2_1_ = 2;
          }
        }
        else if (bVar1 == 0x45) {
LAB_001c4559:
          if ((local_24 == 3) && (iVar2 = sqlite3_strnicmp((char *)_c,"end",3), iVar2 == 0)) {
            nId._2_1_ = 7;
          }
          else if ((local_24 == 7) && (iVar2 = sqlite3_strnicmp((char *)_c,"explain",7), iVar2 == 0)
                  ) {
            nId._2_1_ = 3;
          }
          else {
            nId._2_1_ = 2;
          }
        }
        else if (bVar1 == 0x54) {
LAB_001c44dd:
          if ((local_24 == 7) && (iVar2 = sqlite3_strnicmp((char *)_c,"trigger",7), iVar2 == 0)) {
            nId._2_1_ = 6;
          }
          else if ((local_24 == 4) && (iVar2 = sqlite3_strnicmp((char *)_c,"temp",4), iVar2 == 0)) {
            nId._2_1_ = 5;
          }
          else if ((local_24 == 9) &&
                  (iVar2 = sqlite3_strnicmp((char *)_c,"temporary",9), iVar2 == 0)) {
            nId._2_1_ = 5;
          }
          else {
            nId._2_1_ = 2;
          }
        }
        else {
          if (bVar1 == 99) goto LAB_001c44ae;
          if (bVar1 == 0x65) goto LAB_001c4559;
          if (bVar1 == 0x74) goto LAB_001c44dd;
          nId._2_1_ = 2;
        }
        _c = _c + (local_24 + -1);
      }
      break;
    case 0x22:
    case 0x27:
    case 0x60:
      bVar1 = *_c;
      do {
        _c = _c + 1;
        bVar3 = false;
        if (*_c != 0) {
          bVar3 = *_c != bVar1;
        }
      } while (bVar3);
      if (*_c == 0) {
        return 0;
      }
      nId._2_1_ = 2;
      break;
    case 0x2d:
      if (_c[1] == 0x2d) {
        while( true ) {
          bVar3 = false;
          if (*_c != 0) {
            bVar3 = *_c != 10;
          }
          if (!bVar3) break;
          _c = _c + 1;
        }
        if (*_c == 0) {
          return (uint)(nId._3_1_ == 1);
        }
        nId._2_1_ = 1;
      }
      else {
        nId._2_1_ = 2;
      }
      break;
    case 0x2f:
      if (_c[1] == 0x2a) {
        _c = _c + 2;
        while( true ) {
          bVar3 = false;
          if ((*_c != 0) && (bVar3 = true, *_c == 0x2a)) {
            bVar3 = _c[1] != 0x2f;
          }
          if (!bVar3) break;
          _c = _c + 1;
        }
        if (*_c == 0) {
          return 0;
        }
        _c = _c + 1;
        nId._2_1_ = 1;
      }
      else {
        nId._2_1_ = 2;
      }
      break;
    case 0x3b:
      nId._2_1_ = 0;
      break;
    case 0x5b:
      do {
        _c = _c + 1;
        bVar3 = false;
        if (*_c != 0) {
          bVar3 = *_c != 0x5d;
        }
      } while (bVar3);
      if (*_c == 0) {
        return 0;
      }
      nId._2_1_ = 2;
    }
    nId._3_1_ = sqlite3_complete::trans[nId._3_1_][nId._2_1_];
    _c = _c + 1;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simpler
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zSql==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}